

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

void uv__udp_run_pending(uv_udp_t *handle)

{
  int *piVar1;
  long in_RDI;
  bool bVar2;
  ssize_t size;
  msghdr h;
  QUEUE *q;
  uv_udp_send_t *req;
  ssize_t local_68;
  msghdr local_50;
  long local_18;
  long local_10;
  long local_8;
  
  local_8 = in_RDI;
  do {
    if (local_8 + 0x88 == *(long *)(local_8 + 0x88)) {
      return;
    }
    local_18 = *(long *)(local_8 + 0x88);
    if (local_18 == 0) {
      __assert_fail("q != NULL","src/unix/udp.c",0x5a,"void uv__udp_run_pending(uv_udp_t *)");
    }
    local_10 = local_18 + -0x30;
    if (local_10 == 0) {
      __assert_fail("req != NULL","src/unix/udp.c",0x5d,"void uv__udp_run_pending(uv_udp_t *)");
    }
    memset(&local_50,0,0x38);
    local_50.msg_name = (void *)(local_10 + 0x40);
    local_50.msg_namelen = 0x10;
    if (*(short *)(local_10 + 0x40) == 10) {
      local_50.msg_namelen = 0x1c;
    }
    local_50.msg_iov = *(iovec **)(local_10 + 0x60);
    local_50.msg_iovlen = (size_t)*(uint *)(local_10 + 0x5c);
    do {
      local_68 = sendmsg(*(int *)(local_8 + 0x80),&local_50,0);
      bVar2 = false;
      if (local_68 == -1) {
        piVar1 = __errno_location();
        bVar2 = *piVar1 == 4;
      }
    } while (bVar2);
    if (local_68 == -1) {
      piVar1 = __errno_location();
      if (*piVar1 == 0xb) {
        return;
      }
      piVar1 = __errno_location();
      if (*piVar1 == 0xb) {
        return;
      }
    }
    if (local_68 == -1) {
      piVar1 = __errno_location();
      local_68 = (ssize_t)-*piVar1;
    }
    *(ssize_t *)(local_10 + 0x68) = local_68;
    **(undefined8 **)(local_10 + 0x38) = *(undefined8 *)(local_10 + 0x30);
    *(undefined8 *)(*(long *)(local_10 + 0x30) + 8) = *(undefined8 *)(local_10 + 0x38);
    *(long *)(local_10 + 0x30) = local_8 + 0x98;
    *(undefined8 *)(local_10 + 0x38) = *(undefined8 *)(local_8 + 0xa0);
    **(long **)(local_10 + 0x38) = local_10 + 0x30;
    *(long *)(local_8 + 0xa0) = local_10 + 0x30;
  } while( true );
}

Assistant:

static void uv__udp_run_pending(uv_udp_t* handle) {
  uv_udp_send_t* req;
  QUEUE* q;
  struct msghdr h;
  ssize_t size;

  while (!QUEUE_EMPTY(&handle->write_queue)) {
    q = QUEUE_HEAD(&handle->write_queue);
    assert(q != NULL);

    req = QUEUE_DATA(q, uv_udp_send_t, queue);
    assert(req != NULL);

    memset(&h, 0, sizeof h);
    h.msg_name = &req->addr;
    h.msg_namelen = (req->addr.sin6_family == AF_INET6 ?
      sizeof(struct sockaddr_in6) : sizeof(struct sockaddr_in));
    h.msg_iov = (struct iovec*) req->bufs;
    h.msg_iovlen = req->nbufs;

    do {
      size = sendmsg(handle->io_watcher.fd, &h, 0);
    }
    while (size == -1 && errno == EINTR);

    /* TODO try to write once or twice more in the
     * hope that the socket becomes readable again?
     */
    if (size == -1 && (errno == EAGAIN || errno == EWOULDBLOCK))
      break;

    req->status = (size == -1 ? -errno : size);

    /* Sending a datagram is an atomic operation: either all data
     * is written or nothing is (and EMSGSIZE is raised). That is
     * why we don't handle partial writes. Just pop the request
     * off the write queue and onto the completed queue, done.
     */
    QUEUE_REMOVE(&req->queue);
    QUEUE_INSERT_TAIL(&handle->write_completed_queue, &req->queue);
  }
}